

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

void __thiscall
DyndepParserTestVersionUnexpectedEOF::Run(DyndepParserTestVersionUnexpectedEOF *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_139;
  string err;
  string local_118;
  char kInput [27];
  DyndepParser parser;
  
  builtin_strncpy(kInput + 0x10,"sion = 1.0",0xb);
  builtin_strncpy(kInput,"ninja_dyndep_ver",0x10);
  DyndepParser::DyndepParser
            (&parser,&(this->super_DyndepParserTest).state_,
             (FileReader *)&(this->super_DyndepParserTest).fs_,
             &(this->super_DyndepParserTest).dyndep_file_);
  pTVar1 = g_current_test;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,kInput,&local_139);
  bVar2 = DyndepParser::ParseTest(&parser,&local_118,&err);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x6e,"parser.ParseTest(kInput, &err)");
  std::__cxx11::string::~string((string *)&local_118);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:1: unexpected EOF\nninja_dyndep_version = 1.0\n                          ^ near here"
                          ,&err);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x71,
             "\"input:1: unexpected EOF\\n\" \"ninja_dyndep_version = 1.0\\n\" \"                          ^ near here\" == err"
            );
  std::__cxx11::string::~string((string *)&err);
  DyndepParser::~DyndepParser(&parser);
  return;
}

Assistant:

TEST_F(DyndepParserTest, VersionUnexpectedEOF) {
  const char kInput[] =
"ninja_dyndep_version = 1.0";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:1: unexpected EOF\n"
            "ninja_dyndep_version = 1.0\n"
            "                          ^ near here", err);
}